

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

type_info * pybind11::detail::get_type_info(type_info *tp,bool throw_if_missing)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false> this;
  pointer ppVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator local_61;
  undefined1 local_60 [8];
  string tname;
  type_index local_38;
  _Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false> local_30;
  iterator it;
  unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
  *types;
  bool throw_if_missing_local;
  type_info *tp_local;
  
  this._M_cur = (__node_type *)get_internals();
  it.super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>)
       (_Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>)this._M_cur;
  std::type_index::type_index(&local_38,tp);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
       ::find((unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
               *)this._M_cur,&local_38);
  tname.field_2._8_8_ =
       std::
       unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
       ::end((unordered_map<std::type_index,_void_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_void_*>_>_>
              *)it.super__Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false>._M_cur
            );
  bVar1 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_std::type_index,_void_*>,_false> *)
                     ((long)&tname.field_2 + 8));
  if (bVar1) {
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_std::type_index,_void_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_std::type_index,_void_*>,_false,_false> *)
                        &local_30);
    tp_local = (type_info *)ppVar2->second;
  }
  else {
    if (throw_if_missing) {
      pcVar3 = std::type_info::name(tp);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_60,pcVar3,&local_61);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      clean_type_id((string *)local_60);
      std::operator+(&local_b8,"pybind11::detail::get_type_info: unable to find type info for \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::operator+(&local_98,&local_b8,"\"");
      pybind11_fail(&local_98);
    }
    tp_local = (type_info *)0x0;
  }
  return (type_info *)tp_local;
}

Assistant:

PYBIND11_NOINLINE inline detail::type_info *get_type_info(const std::type_info &tp,
                                                          bool throw_if_missing = false) {
    auto &types = get_internals().registered_types_cpp;

    auto it = types.find(std::type_index(tp));
    if (it != types.end())
        return (detail::type_info *) it->second;
    if (throw_if_missing) {
        std::string tname = tp.name();
        detail::clean_type_id(tname);
        pybind11_fail("pybind11::detail::get_type_info: unable to find type info for \"" + tname + "\"");
    }
    return nullptr;
}